

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O3

void mp_mul_internal(mp_int *r,mp_int *a,mp_int *b,mp_int scratch)

{
  BignumInt *pBVar1;
  ulong *puVar2;
  ulong *puVar3;
  BignumInt *pBVar4;
  ulong *puVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong *puVar8;
  undefined1 auVar9 [16];
  size_t i;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong *puVar14;
  ulong uVar15;
  ulong *puVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong *puVar20;
  BignumInt BVar21;
  ulong uVar22;
  BignumInt *pBVar23;
  BignumInt BVar24;
  ulong uVar25;
  ulong uVar26;
  mp_int scratch_00;
  mp_int scratch_01;
  mp_int scratch_02;
  mp_int scratch_03;
  mp_int asum;
  mp_int a1;
  mp_int bsum;
  mp_int b1;
  mp_int b0;
  mp_int r2;
  mp_int a0;
  mp_int product;
  mp_int r0;
  mp_int local_120;
  BignumInt *local_110;
  ulong local_108;
  ulong local_100;
  BignumInt *local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  BignumInt *local_d8;
  BignumInt *local_d0;
  BignumInt *local_c8;
  BignumInt *local_c0;
  ulong local_b8;
  mp_int local_b0;
  mp_int local_a0;
  mp_int local_90;
  mp_int local_80;
  mp_int local_70;
  mp_int local_60;
  mp_int local_50;
  mp_int local_40;
  
  pBVar23 = scratch.w;
  uVar11 = scratch.nw;
  uVar13 = b->nw;
  if (b->nw < a->nw) {
    uVar13 = a->nw;
  }
  uVar10 = r->nw;
  if (uVar10 < uVar13) {
    uVar13 = uVar10;
  }
  if (uVar11 < uVar13 * 6) {
    __assert_fail("scratch.nw >= mp_mul_scratchspace_unary(inlen)",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c"
                  ,0x3f7,"void mp_mul_internal(mp_int *, mp_int *, mp_int *, mp_int)");
  }
  smemclr(r->w,uVar10 << 3);
  uVar10 = a->nw;
  uVar15 = b->nw;
  if (uVar10 != 0 && 0x17 < uVar13) {
    if (uVar15 != 0) {
      local_108 = uVar13 >> 1;
      uVar26 = uVar13 - local_108;
      local_c8 = a->w;
      local_b8 = uVar26;
      if (uVar10 < uVar26) {
        local_b8 = uVar10;
      }
      local_d8 = b->w;
      local_e0 = uVar26;
      if (uVar15 < uVar26) {
        local_e0 = uVar15;
      }
      uVar19 = uVar10 - local_b8;
      if (local_108 <= uVar10 - local_b8) {
        uVar19 = local_108;
      }
      local_d0 = local_c8 + local_b8;
      uVar10 = uVar15 - local_e0;
      if (local_108 <= uVar15 - local_e0) {
        uVar10 = local_108;
      }
      local_c0 = local_d8 + local_e0;
      local_e8 = uVar26 * 2;
      uVar15 = r->nw;
      local_100 = local_e8;
      if (uVar15 < local_e8) {
        local_100 = uVar15;
      }
      uVar25 = uVar26;
      if (uVar15 < uVar26) {
        uVar25 = uVar15;
      }
      uVar18 = uVar15 - uVar25;
      if (uVar15 <= uVar15 - uVar25) {
        uVar18 = uVar15;
      }
      local_f0 = uVar15 - local_100;
      if (uVar15 <= uVar15 - local_100) {
        local_f0 = uVar15;
      }
      pBVar4 = r->w;
      local_f8 = pBVar4 + local_100;
      local_110 = pBVar4;
      local_b0.nw = uVar19;
      local_b0.w = local_d0;
      local_90.nw = uVar10;
      local_90.w = local_c0;
      local_80.nw = local_e0;
      local_80.w = local_d8;
      local_70.nw = local_f0;
      local_70.w = local_f8;
      local_60.nw = local_b8;
      local_60.w = local_c8;
      local_40.nw = local_100;
      local_40.w = pBVar4;
      mp_mul_internal(&local_40,&local_60,&local_80,scratch);
      mp_mul_internal(&local_70,&local_b0,&local_90,scratch);
      uVar15 = local_e8;
      if (r->nw < uVar13 * 2) {
        if (uVar18 <= uVar13) {
          uVar13 = uVar18;
        }
        if (uVar13 <= uVar11) {
          if (uVar11 - uVar13 < uVar11) {
            uVar11 = uVar11 - uVar13;
          }
          pBVar1 = pBVar23 + uVar13;
          scratch_00.w = pBVar1;
          scratch_00.nw = uVar11;
          local_120.nw = uVar13;
          local_120.w = pBVar23;
          mp_mul_internal(&local_120,&local_60,&local_90,scratch_00);
          if (uVar18 != 0) {
            uVar15 = 0;
            uVar10 = 0;
            do {
              if (uVar10 < uVar13) {
                uVar26 = pBVar23[uVar10];
              }
              else {
                uVar26 = 0;
              }
              uVar19 = uVar15 + pBVar4[uVar25 + uVar10];
              uVar15 = (ulong)CARRY8(uVar15,pBVar4[uVar25 + uVar10]) + (ulong)CARRY8(uVar19,uVar26);
              pBVar4[uVar25 + uVar10] = uVar19 + uVar26;
              uVar10 = uVar10 + 1;
            } while (uVar18 != uVar10);
            scratch_01.w = pBVar1;
            scratch_01.nw = uVar11;
            mp_mul_internal(&local_120,&local_b0,&local_80,scratch_01);
            uVar10 = 0;
            uVar11 = 0;
            do {
              if (uVar11 < uVar13) {
                uVar15 = pBVar23[uVar11];
              }
              else {
                uVar15 = 0;
              }
              uVar26 = uVar10 + pBVar4[uVar25 + uVar11];
              uVar10 = (ulong)CARRY8(uVar10,pBVar4[uVar25 + uVar11]) + (ulong)CARRY8(uVar26,uVar15);
              pBVar4[uVar25 + uVar11] = uVar26 + uVar15;
              uVar11 = uVar11 + 1;
            } while (uVar18 != uVar11);
            return;
          }
          scratch_03.w = pBVar1;
          scratch_03.nw = uVar11;
          mp_mul_internal(&local_120,&local_b0,&local_80,scratch_03);
          return;
        }
      }
      else {
        uVar26 = uVar26 + 1;
        uVar12 = uVar11 - uVar26;
        if ((uVar26 <= uVar11) && (local_120.nw = uVar26, local_120.w = pBVar23, uVar26 <= uVar12))
        {
          if (uVar12 < uVar11) {
            uVar11 = uVar12;
          }
          uVar12 = uVar11 - uVar26;
          if (uVar11 <= uVar11 - uVar26) {
            uVar12 = uVar11;
          }
          local_a0.w = pBVar23 + uVar26;
          if (uVar26 != 0) {
            uVar17 = 0;
            uVar11 = 0;
            do {
              if (uVar11 < local_b8) {
                BVar21 = local_c8[uVar11];
              }
              else {
                BVar21 = 0;
              }
              if (uVar11 < uVar19) {
                BVar24 = local_d0[uVar11];
              }
              else {
                BVar24 = 0;
              }
              uVar22 = BVar21 + uVar17;
              uVar17 = (ulong)CARRY8(BVar21,uVar17) + (ulong)CARRY8(uVar22,BVar24);
              if (pBVar23 != (BignumInt *)0x0) {
                pBVar23[uVar11] = uVar22 + BVar24;
              }
              uVar11 = uVar11 + 1;
            } while (uVar26 != uVar11);
            uVar19 = 0;
            uVar11 = 0;
            do {
              if (uVar11 < local_e0) {
                BVar21 = local_d8[uVar11];
              }
              else {
                BVar21 = 0;
              }
              if (uVar11 < uVar10) {
                BVar24 = local_c0[uVar11];
              }
              else {
                BVar24 = 0;
              }
              uVar17 = BVar21 + uVar19;
              uVar19 = (ulong)CARRY8(BVar21,uVar19) + (ulong)CARRY8(uVar17,BVar24);
              local_a0.w[uVar11] = uVar17 + BVar24;
              uVar11 = uVar11 + 1;
            } while (uVar26 != uVar11);
          }
          local_a0.nw = uVar26;
          if (local_e8 < uVar12) {
            pBVar1 = local_a0.w + uVar26;
            local_50.nw = local_e8 | 1;
            uVar11 = uVar12 - local_50.nw;
            if (uVar12 <= uVar12 - local_50.nw) {
              uVar11 = uVar12;
            }
            scratch_02.w = pBVar1 + local_e8 + 1;
            scratch_02.nw = uVar11;
            local_50.w = pBVar1;
            mp_mul_internal(&local_50,&local_120,&local_a0,scratch_02);
            uVar10 = uVar13 * 2 + local_108 * -2 + 1;
            uVar13 = 1;
            uVar11 = 0;
            do {
              if (uVar15 < uVar11) {
                uVar26 = 0;
              }
              else {
                uVar26 = pBVar1[uVar11];
              }
              uVar19 = 0xffffffffffffffff;
              if (uVar11 < local_100) {
                uVar19 = ~local_110[uVar11];
              }
              uVar12 = uVar26 + uVar13;
              uVar13 = (ulong)CARRY8(uVar26,uVar13) + (ulong)CARRY8(uVar12,uVar19);
              if (pBVar23 != (BignumInt *)0x0) {
                pBVar1[uVar11] = uVar12 + uVar19;
              }
              uVar11 = uVar11 + 1;
            } while (uVar10 != uVar11);
            uVar13 = 1;
            uVar11 = 0;
            do {
              if (uVar15 < uVar11) {
                uVar26 = 0;
              }
              else {
                uVar26 = pBVar1[uVar11];
              }
              uVar19 = 0xffffffffffffffff;
              if (uVar11 < local_f0) {
                uVar19 = ~local_f8[uVar11];
              }
              uVar12 = uVar26 + uVar13;
              uVar13 = (ulong)CARRY8(uVar26,uVar13) + (ulong)CARRY8(uVar12,uVar19);
              if (pBVar23 != (BignumInt *)0x0) {
                pBVar1[uVar11] = uVar12 + uVar19;
              }
              uVar11 = uVar11 + 1;
            } while (uVar10 != uVar11);
            if (uVar18 == 0) {
              return;
            }
            uVar13 = 0;
            uVar11 = 0;
            do {
              if (uVar15 < uVar11) {
                uVar10 = 0;
              }
              else {
                uVar10 = pBVar1[uVar11];
              }
              uVar26 = uVar13 + pBVar4[uVar25 + uVar11];
              uVar13 = (ulong)CARRY8(uVar13,pBVar4[uVar25 + uVar11]) + (ulong)CARRY8(uVar26,uVar10);
              pBVar4[uVar25 + uVar11] = uVar26 + uVar10;
              uVar11 = uVar11 + 1;
            } while (uVar18 != uVar11);
            return;
          }
        }
      }
      __assert_fail("len <= pool->nw",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c"
                    ,699,"mp_int mp_alloc_from_scratch(mp_int *, size_t)");
    }
    uVar15 = 0;
  }
  if (0 < (long)r->nw && 0 < (long)uVar10) {
    puVar16 = r->w;
    puVar20 = a->w;
    puVar5 = b->w;
    puVar2 = puVar20 + uVar10;
    puVar3 = puVar16 + r->nw;
    do {
      puVar14 = puVar16;
      if ((long)uVar15 < 1) {
        uVar11 = 0;
      }
      else {
        uVar13 = *puVar20;
        uVar11 = 0;
        puVar8 = puVar5;
        do {
          auVar6._8_8_ = 0;
          auVar6._0_8_ = uVar13;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = *puVar8;
          auVar9[8] = CARRY8(uVar11,*puVar14);
          auVar9._0_8_ = uVar11 + *puVar14;
          auVar9._9_7_ = 0;
          auVar9 = auVar6 * auVar7 + auVar9;
          *puVar14 = auVar9._0_8_;
          uVar11 = auVar9._8_8_;
          puVar14 = puVar14 + 1;
          if (puVar5 + uVar15 <= puVar8 + 1) break;
          puVar8 = puVar8 + 1;
        } while (puVar14 < puVar3);
      }
      for (; puVar14 < puVar3; puVar14 = puVar14 + 1) {
        uVar13 = *puVar14;
        *puVar14 = *puVar14 + uVar11;
        uVar11 = (ulong)CARRY8(uVar13,uVar11);
      }
      puVar20 = puVar20 + 1;
    } while ((puVar20 < puVar2) && (puVar16 = puVar16 + 1, puVar16 < puVar3));
  }
  return;
}

Assistant:

static void mp_mul_internal(mp_int *r, mp_int *a, mp_int *b, mp_int scratch)
{
    size_t inlen = size_t_min(r->nw, size_t_max(a->nw, b->nw));
    assert(scratch.nw >= mp_mul_scratchspace_unary(inlen));

    mp_clear(r);

    if (inlen < KARATSUBA_THRESHOLD || a->nw == 0 || b->nw == 0) {
        /*
         * The input numbers are too small to bother optimising. Go
         * straight to the simple primitive approach.
         */
        mp_mul_add_simple(r, a, b);
        return;
    }

    /*
     * Karatsuba divide-and-conquer algorithm. We cut each input in
     * half, so that it's expressed as two big 'digits' in a giant
     * base D:
     *
     *   a = a_1 D + a_0
     *   b = b_1 D + b_0
     *
     * Then the product is of course
     *
     *   ab = a_1 b_1 D^2 + (a_1 b_0 + a_0 b_1) D + a_0 b_0
     *
     * and we compute the three coefficients by recursively calling
     * ourself to do half-length multiplications.
     *
     * The clever bit that makes this worth doing is that we only need
     * _one_ half-length multiplication for the central coefficient
     * rather than the two that it obviouly looks like, because we can
     * use a single multiplication to compute
     *
     *   (a_1 + a_0) (b_1 + b_0) = a_1 b_1 + a_1 b_0 + a_0 b_1 + a_0 b_0
     *
     * and then we subtract the other two coefficients (a_1 b_1 and
     * a_0 b_0) which we were computing anyway.
     *
     * Hence we get to multiply two numbers of length N in about three
     * times as much work as it takes to multiply numbers of length
     * N/2, which is obviously better than the four times as much work
     * it would take if we just did a long conventional multiply.
     */

    /* Break up the input as botlen + toplen, with botlen >= toplen.
     * The 'base' D is equal to 2^{botlen * BIGNUM_INT_BITS}. */
    size_t toplen = inlen / 2;
    size_t botlen = inlen - toplen;

    /* Alias bignums that address the two halves of a,b, and useful
     * pieces of r. */
    mp_int a0 = mp_make_alias(a, 0, botlen);
    mp_int b0 = mp_make_alias(b, 0, botlen);
    mp_int a1 = mp_make_alias(a, botlen, toplen);
    mp_int b1 = mp_make_alias(b, botlen, toplen);
    mp_int r0 = mp_make_alias(r, 0, botlen*2);
    mp_int r1 = mp_make_alias(r, botlen, r->nw);
    mp_int r2 = mp_make_alias(r, botlen*2, r->nw);

    /* Recurse to compute a0*b0 and a1*b1, in their correct positions
     * in the output bignum. They can't overlap. */
    mp_mul_internal(&r0, &a0, &b0, scratch);
    mp_mul_internal(&r2, &a1, &b1, scratch);

    if (r->nw < inlen*2) {
        /*
         * The output buffer isn't large enough to require the whole
         * product, so some of a1*b1 won't have been stored. In that
         * case we won't try to do the full Karatsuba optimisation;
         * we'll just recurse again to compute a0*b1 and a1*b0 - or at
         * least as much of them as the output buffer size requires -
         * and add each one in.
         */
        mp_int s = mp_alloc_from_scratch(
            &scratch, size_t_min(botlen+toplen, r1.nw));

        mp_mul_internal(&s, &a0, &b1, scratch);
        mp_add_into(&r1, &r1, &s);
        mp_mul_internal(&s, &a1, &b0, scratch);
        mp_add_into(&r1, &r1, &s);
        return;
    }

    /* a0+a1 and b0+b1 */
    mp_int asum = mp_alloc_from_scratch(&scratch, botlen+1);
    mp_int bsum = mp_alloc_from_scratch(&scratch, botlen+1);
    mp_add_into(&asum, &a0, &a1);
    mp_add_into(&bsum, &b0, &b1);

    /* Their product */
    mp_int product = mp_alloc_from_scratch(&scratch, botlen*2+1);
    mp_mul_internal(&product, &asum, &bsum, scratch);

    /* Subtract off the outer terms we already have */
    mp_sub_into(&product, &product, &r0);
    mp_sub_into(&product, &product, &r2);

    /* And add it in with the right offset. */
    mp_add_into(&r1, &r1, &product);
}